

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto_test.cc
# Opt level: O0

void __thiscall
upb_test::FuzzTest_EnumValueEmbeddedNull_Test::~FuzzTest_EnumValueEmbeddedNull_Test
          (FuzzTest_EnumValueEmbeddedNull_Test *this)

{
  FuzzTest_EnumValueEmbeddedNull_Test *this_local;
  
  ~FuzzTest_EnumValueEmbeddedNull_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(FuzzTest, EnumValueEmbeddedNull) {
  RoundTripDescriptor(ParseTextProtoOrDie(
      R"pb(file {
             name: "\035"
             enum_type {
               name: "f"
               value { name: "\000" number: 0 }
             }
           })pb"));
}